

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertersC.cpp
# Opt level: O0

char ** SoapySDRConverter_listTargetFormats(char *sourceFormat,size_t *length)

{
  char **ppcVar1;
  undefined8 *in_RSI;
  char *in_RDI;
  exception *ex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  allocator local_51;
  size_t in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_fffffffffffffff8;
  
  *in_RSI = 0;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RDI,&local_51);
  SoapySDR::ConverterRegistry::listTargetFormats(in_stack_fffffffffffffff8);
  ppcVar1 = toStrArray(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                      );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return ppcVar1;
}

Assistant:

char **SoapySDRConverter_listTargetFormats(const char *sourceFormat, size_t *length)
{
    *length = 0;

    __SOAPY_SDR_C_TRY
    return toStrArray(SoapySDR::ConverterRegistry::listTargetFormats(sourceFormat), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}